

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

double __thiscall
Gudhi::Persistence_representations::Persistence_landscape::compute_integral_of_landscape
          (Persistence_landscape *this)

{
  pointer pvVar1;
  size_t i;
  long lVar2;
  double *pdVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  
  pvVar1 = (this->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar6 = 0.0;
  for (lVar2 = 0;
      lVar2 != ((long)(this->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
      lVar2 = lVar2 + 1) {
    lVar4 = *(long *)&pvVar1[lVar2].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl;
    pdVar3 = (double *)(lVar4 + 0x28);
    lVar4 = ((long)*(pointer *)
                    ((long)&pvVar1[lVar2].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8) - lVar4 >> 4) + -3;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      dVar6 = dVar6 + (*pdVar3 + pdVar3[-2]) * (pdVar3[-1] - pdVar3[-3]) * 0.5;
      pdVar3 = pdVar3 + 2;
    }
  }
  return dVar6;
}

Assistant:

double Persistence_landscape::compute_integral_of_landscape() const {
  double result = 0;
  for (size_t i = 0; i != this->land.size(); ++i) {
    for (size_t nr = 2; nr != this->land[i].size() - 1; ++nr) {
      // it suffices to compute every planar integral and then sum them up for each lambda_n
      result += 0.5 * (this->land[i][nr].first - this->land[i][nr - 1].first) *
                (this->land[i][nr].second + this->land[i][nr - 1].second);
    }
  }
  return result;
}